

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# callback.cpp
# Opt level: O1

string * __thiscall
LiteScript::_Type_CALLBACK::ToString_abi_cxx11_
          (string *__return_storage_ptr__,_Type_CALLBACK *this,Variable *object)

{
  bool bVar1;
  Object *pOVar2;
  ostream *poVar3;
  long lVar4;
  char *pcVar5;
  stringstream ss;
  stringstream local_1a0 [16];
  ostream local_190 [112];
  ios_base local_120 [264];
  
  std::__cxx11::stringstream::stringstream(local_1a0);
  pOVar2 = Variable::operator->(object);
  bVar1 = Callback::isInternal((Callback *)pOVar2->data);
  poVar3 = local_190;
  if (bVar1) {
    lVar4 = 0xb;
    pcVar5 = "f(internal)";
  }
  else {
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,"f(I=",4);
    poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,",L=",3);
    poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
    lVar4 = 1;
    pcVar5 = ")";
  }
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,pcVar5,lVar4);
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream(local_1a0);
  std::ios_base::~ios_base(local_120);
  return __return_storage_ptr__;
}

Assistant:

std::string LiteScript::_Type_CALLBACK::ToString(const Variable &object) const {
    std::stringstream ss;
    const Callback& C = object->GetData<Callback>();
    if (C.isInternal())
        ss << "f(internal)";
    else
        ss << "f(I=" << C.I << ",L=" << C.L << ")";
    return ss.str();
}